

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall OpenMD::ForceMatrixDecomposition::collectSelfData(ForceMatrixDecomposition *this)

{
  double *pdVar1;
  long in_RDI;
  
  pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 200),0);
  MPI_Allreduce(1,pdVar1,7,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x138),0);
  MPI_Allreduce(1,pdVar1,7,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RDI + 0x1a8),0);
  MPI_Allreduce(1,pdVar1,7,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  return;
}

Assistant:

void ForceMatrixDecomposition::collectSelfData() {
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &selfPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &excludedSelfPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);

    MPI_Allreduce(MPI_IN_PLACE, &selectedSelfPot[0], N_INTERACTION_FAMILIES,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif
  }